

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall CaDiCaL::Solver::set_long_option(Solver *this,char *arg)

{
  bool bVar1;
  char *__ptr;
  size_t sStack_40;
  int val;
  string name;
  
  require_solver_pointer_to_be_non_zero
            (this,"bool CaDiCaL::Solver::set_long_option(const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  if (this->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set_long_option(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
LAB_006844f0:
    sStack_40 = 0x1f;
  }
  else {
    if (this->internal == (Internal *)0x0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "bool CaDiCaL::Solver::set_long_option(const char *)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      __ptr = "internal solver not initialized";
      goto LAB_006844f0;
    }
    if ((this->_state & VALID) != 0) {
      if (this->_state == CONFIGURING) {
        if ((*arg == '-') && (arg[1] == '-')) {
          name._M_dataplus._M_p = (pointer)&name.field_2;
          name._M_string_length = 0;
          name.field_2._M_local_buf[0] = '\0';
          bVar1 = Options::parse_long_option(arg,&name,&val);
          if (bVar1) {
            set(this,name._M_dataplus._M_p,val);
          }
          std::__cxx11::string::~string((string *)&name);
        }
        else {
          bVar1 = false;
        }
        return bVar1;
      }
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "bool CaDiCaL::Solver::set_long_option(const char *)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      fprintf(_stderr,"can only set option \'%s\' right after initialization",arg);
      fputc(10,_stderr);
      goto LAB_00684591;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::set_long_option(const char *)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "solver in invalid state";
    sStack_40 = 0x17;
  }
  fwrite(__ptr,sStack_40,1,_stderr);
  fputc(10,_stderr);
LAB_00684591:
  fflush(_stderr);
  abort();
}

Assistant:

bool Solver::set_long_option (const char *arg) {
  LOG_API_CALL_BEGIN ("set", arg);
  REQUIRE_VALID_STATE ();
  REQUIRE (state () == CONFIGURING,
           "can only set option '%s' right after initialization", arg);
  bool res;
  if (arg[0] != '-' || arg[1] != '-')
    res = false;
  else {
    int val;
    string name;
    res = Options::parse_long_option (arg, name, val);
    if (res)
      set (name.c_str (), val);
  }
  LOG_API_CALL_END ("set", arg, res);
  return res;
}